

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t read_part_content(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  curl_off_t *pcVar1;
  void *pvVar2;
  curl_mimepart *pcVar3;
  curl_read_callback p_Var4;
  int iVar5;
  size_t offset;
  ulong __n;
  size_t sVar6;
  long lVar7;
  char *__src;
  size_t sVar8;
  
  sVar8 = part->lastreadstatus;
  if (sVar8 + 1 < 2) {
    return sVar8;
  }
  if (sVar8 - 0x10000000 < 2) {
    return sVar8;
  }
  if ((part->datasize == -1) || ((part->state).offset < part->datasize)) {
    if (part->kind != MIMEKIND_FILE) {
      if (part->kind == MIMEKIND_MULTIPART) {
        if (bufsize == 0) goto LAB_005089bd;
        pvVar2 = part->arg;
        sVar8 = 0;
        do {
          __n = 0;
          if (*(uint *)((long)pvVar2 + 0x50) < 9) {
            pcVar3 = *(curl_mimepart **)((long)pvVar2 + 0x58);
            switch(*(uint *)((long)pvVar2 + 0x50)) {
            case 0:
            case 4:
              *(undefined4 *)((long)pvVar2 + 0x50) = 5;
              *(undefined8 *)((long)pvVar2 + 0x58) = *(undefined8 *)((long)pvVar2 + 0x10);
              *(undefined8 *)((long)pvVar2 + 0x60) = 2;
LAB_005087ee:
              __n = 0;
              break;
            case 5:
              sVar6 = curlx_sotouz(*(curl_off_t *)((long)pvVar2 + 0x60));
              if (sVar6 < 4) {
                __src = "\r\n--" + sVar6;
                __n = 4 - sVar6;
                if (bufsize <= 4 - sVar6) {
                  __n = bufsize;
                }
                goto LAB_005088eb;
              }
              *(undefined4 *)((long)pvVar2 + 0x50) = 6;
LAB_0050892c:
              *(curl_mimepart **)((long)pvVar2 + 0x58) = pcVar3;
LAB_00508930:
              *(undefined8 *)((long)pvVar2 + 0x60) = 0;
              __n = 0;
              break;
            case 6:
              sVar6 = curlx_sotouz(*(curl_off_t *)((long)pvVar2 + 0x60));
              if (pcVar3 == (curl_mimepart *)0x0) {
                if (sVar6 < 0x28) goto LAB_005088d0;
                if (3 < sVar6 - 0x28) goto LAB_00508925;
                __src = "multipart/form-data" + sVar6 + 0xe;
                lVar7 = 0x2c;
              }
              else if (sVar6 < 0x28) {
LAB_005088d0:
                __src = (char *)((long)pvVar2 + sVar6 + 0x20);
                lVar7 = 0x28;
              }
              else {
                if (1 < sVar6 - 0x28) {
LAB_00508925:
                  *(undefined4 *)((long)pvVar2 + 0x50) = 7;
                  goto LAB_0050892c;
                }
                __src = "\" has source files which vary by configuration. This is not supported by the \""
                        + sVar6 + 0x45;
                lVar7 = 0x2a;
              }
              __n = lVar7 - sVar6;
              if (bufsize <= lVar7 - sVar6) {
                __n = bufsize;
              }
LAB_005088eb:
              memcpy(buffer,__src,__n);
              *(long *)((long)pvVar2 + 0x60) = *(long *)((long)pvVar2 + 0x60) + __n;
              break;
            case 7:
              if (pcVar3 == (curl_mimepart *)0x0) {
                *(undefined4 *)((long)pvVar2 + 0x50) = 8;
                *(undefined8 *)((long)pvVar2 + 0x58) = 0;
                *(undefined8 *)((long)pvVar2 + 0x60) = 0;
                goto LAB_005087ee;
              }
              __n = readback_part(pcVar3,buffer,bufsize,hasread);
              if (__n == 0) {
                pcVar3 = pcVar3->nextpart;
                *(undefined4 *)((long)pvVar2 + 0x50) = 5;
                *(curl_mimepart **)((long)pvVar2 + 0x58) = pcVar3;
                goto LAB_00508930;
              }
              if ((__n - 0x10000000 < 2) || (__n + 2 < 2)) {
                if (sVar8 == 0) {
                  sVar8 = __n;
                }
                goto switchD_005087d5_caseD_8;
              }
              break;
            case 8:
              goto switchD_005087d5_caseD_8;
            }
          }
          sVar8 = sVar8 + __n;
          buffer = buffer + __n;
          bufsize = bufsize - __n;
        } while (bufsize != 0);
      }
      else {
LAB_00508964:
        p_Var4 = part->readfunc;
        if (p_Var4 == (curl_read_callback)0x0) goto LAB_005089bd;
        if ((part->flags & 4) == 0) {
          if (*hasread != false) {
            return 0xfffffffffffffffe;
          }
          *hasread = true;
        }
        sVar8 = (*p_Var4)(buffer,1,bufsize,part->arg);
      }
switchD_005087d5_caseD_8:
      if ((1 < sVar8 + 1) && (1 < sVar8 - 0x10000000)) {
        if (sVar8 == 0xfffffffffffffffe) {
          return 0xfffffffffffffffe;
        }
        pcVar1 = &(part->state).offset;
        *pcVar1 = *pcVar1 + sVar8;
      }
      goto LAB_005089c0;
    }
    if (((FILE *)part->fp == (FILE *)0x0) || (iVar5 = feof((FILE *)part->fp), iVar5 == 0))
    goto LAB_00508964;
  }
LAB_005089bd:
  sVar8 = 0;
LAB_005089c0:
  part->lastreadstatus = sVar8;
  return sVar8;
}

Assistant:

static size_t read_part_content(curl_mimepart *part,
                                char *buffer, size_t bufsize, bool *hasread)
{
  size_t sz = 0;

  switch(part->lastreadstatus) {
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    return part->lastreadstatus;
  default:
    break;
  }

  /* If we can determine we are at end of part data, spare a read. */
  if(part->datasize != (curl_off_t) -1 &&
     part->state.offset >= part->datasize) {
    /* sz is already zero. */
  }
  else {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      /*
       * Cannot be processed as other kinds since read function requires
       * an additional parameter and is highly recursive.
       */
       sz = mime_subparts_read(buffer, 1, bufsize, part->arg, hasread);
       break;
    case MIMEKIND_FILE:
      if(part->fp && feof(part->fp))
        break;  /* At EOF. */
      /* FALLTHROUGH */
    default:
      if(part->readfunc) {
        if(!(part->flags & MIME_FAST_READ)) {
          if(*hasread)
            return STOP_FILLING;
          *hasread = TRUE;
        }
        sz = part->readfunc(buffer, 1, bufsize, part->arg);
      }
      break;
    }
  }

  switch(sz) {
  case STOP_FILLING:
    break;
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    part->lastreadstatus = sz;
    break;
  default:
    part->state.offset += sz;
    part->lastreadstatus = sz;
    break;
  }

  return sz;
}